

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

void wallet::PreventOutdatedOptions(UniValue *options)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"feeRate",(allocator<char> *)&local_60);
  bVar1 = UniValue::exists(options,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    std::operator+(&local_60,"Use fee_rate (",&::CURRENCY_ATOM_abi_cxx11_);
    std::operator+(&local_40,&local_60,"/vB) instead of feeRate");
    JSONRPCError(pUVar2,-8,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"changeAddress",(allocator<char> *)&local_60);
    bVar1 = UniValue::exists(options,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Use change_address instead of changeAddress",
                 (allocator<char> *)&local_60);
      JSONRPCError(pUVar2,-8,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"changePosition",(allocator<char> *)&local_60);
      bVar1 = UniValue::exists(options,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (bVar1) {
        pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Use change_position instead of changePosition",
                   (allocator<char> *)&local_60);
        JSONRPCError(pUVar2,-8,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"includeWatching",(allocator<char> *)&local_60);
        bVar1 = UniValue::exists(options,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        if (bVar1) {
          pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"Use include_watching instead of includeWatching",
                     (allocator<char> *)&local_60);
          JSONRPCError(pUVar2,-8,&local_40);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
          }
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_40,"lockUnspents",(allocator<char> *)&local_60);
          bVar1 = UniValue::exists(options,&local_40);
          std::__cxx11::string::~string((string *)&local_40);
          if (bVar1) {
            pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,"Use lock_unspents instead of lockUnspents",
                       (allocator<char> *)&local_60);
            JSONRPCError(pUVar2,-8,&local_40);
            if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
              __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
            }
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_40,"subtractFeeFromOutputs",(allocator<char> *)&local_60);
            bVar1 = UniValue::exists(options,&local_40);
            std::__cxx11::string::~string((string *)&local_40);
            if (bVar1) {
              pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_40,
                         "Use subtract_fee_from_outputs instead of subtractFeeFromOutputs",
                         (allocator<char> *)&local_60);
              JSONRPCError(pUVar2,-8,&local_40);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
              }
            }
            else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
              return;
            }
          }
        }
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

static void PreventOutdatedOptions(const UniValue& options)
{
    if (options.exists("feeRate")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use fee_rate (" + CURRENCY_ATOM + "/vB) instead of feeRate");
    }
    if (options.exists("changeAddress")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use change_address instead of changeAddress");
    }
    if (options.exists("changePosition")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use change_position instead of changePosition");
    }
    if (options.exists("includeWatching")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use include_watching instead of includeWatching");
    }
    if (options.exists("lockUnspents")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use lock_unspents instead of lockUnspents");
    }
    if (options.exists("subtractFeeFromOutputs")) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Use subtract_fee_from_outputs instead of subtractFeeFromOutputs");
    }
}